

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultIOStream.cpp
# Opt level: O0

size_t __thiscall Assimp::DefaultIOStream::FileSize(DefaultIOStream *this)

{
  int iVar1;
  ulong uVar2;
  char *__file;
  unsigned_long_long cachedSize;
  undefined1 local_a8 [4];
  int err;
  stat fileStat;
  DefaultIOStream *this_local;
  
  if ((this->mFile != (FILE *)0x0) &&
     (fileStat.__glibc_reserved[2] = (__syscall_slong_t)this, uVar2 = std::__cxx11::string::empty(),
     (uVar2 & 1) == 0)) {
    if (this->mCachedSize == 0xffffffffffffffff) {
      __file = (char *)std::__cxx11::string::c_str();
      iVar1 = stat(__file,(stat *)local_a8);
      if (iVar1 != 0) {
        return 0;
      }
      this->mCachedSize = fileStat.st_rdev;
    }
    return this->mCachedSize;
  }
  return 0;
}

Assistant:

size_t DefaultIOStream::FileSize() const
{
    if (! mFile || mFilename.empty()) {
        return 0;
    }

    if (SIZE_MAX == mCachedSize ) {

        // Although fseek/ftell would allow us to reuse the existing file handle here,
        // it is generally unsafe because:
        //  - For binary streams, it is not technically well-defined
        //  - For text files the results are meaningless
        // That's why we use the safer variant fstat here.
        //
        // See here for details:
        // https://www.securecoding.cert.org/confluence/display/seccode/FIO19-C.+Do+not+use+fseek()+and+ftell()+to+compute+the+size+of+a+regular+file
#if defined _WIN32 && (!defined __GNUC__ || __MSVCRT_VERSION__ >= 0x0601)
        struct __stat64 fileStat;
        //using fileno + fstat avoids having to handle the filename
        int err = _fstat64(  _fileno(mFile), &fileStat );
        if (0 != err)
            return 0;
        mCachedSize = (size_t) (fileStat.st_size);
#elif defined __GNUC__ || defined __APPLE__ || defined __MACH__ || defined __FreeBSD__
        struct stat fileStat;
        int err = stat(mFilename.c_str(), &fileStat );
        if (0 != err)
            return 0;
        const unsigned long long cachedSize = fileStat.st_size;
        mCachedSize = static_cast< size_t >( cachedSize );
#else
#   error "Unknown platform"
#endif
    }
    return mCachedSize;
}